

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

char * __thiscall Json::ValueIteratorBase::index(ValueIteratorBase *this,char *__s,int __c)

{
  CZString czstring;
  CZString local_20;
  
  Value::CZString::CZString(&local_20,(CZString *)((this->current_)._M_node + 1));
  Value::CZString::~CZString(&local_20);
  return (char *)(ulong)(-(uint)(local_20.cstr_ != (char *)0x0) | local_20.index_);
}

Assistant:

bool Reader::parse(std::istream& sin, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(sin);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since std::string is reference-counted, this at least does not
  // create an extra copy.
  std::string doc;
  std::getline(sin, doc, (char)EOF);
  return parse(doc, root, collectComments);
}